

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O0

void __thiscall FSDist_COF::SanityCheck(FSDist_COF *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  FSDist_COF *this_00;
  reference this_01;
  FSDist_COF *pFVar4;
  reference pvVar5;
  ostream *poVar6;
  ostream *sum;
  void *this_02;
  stringstream *arg;
  long in_RDI;
  double dVar7;
  stringstream ss;
  Index valI;
  double psum;
  Index sfacI;
  double in_stack_fffffffffffffdd8;
  E *in_stack_fffffffffffffde0;
  Index sfacI_00;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [380];
  uint local_1c;
  double local_18;
  uint local_c;
  
  local_c = 0;
  do {
    uVar2 = (ulong)local_c;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RDI + 0x30));
    if (sVar3 <= uVar2) {
      return;
    }
    local_18 = 0.0;
    local_1c = 0;
    while( true ) {
      this_00 = (FSDist_COF *)(ulong)local_1c;
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
      pFVar4 = (FSDist_COF *)std::vector<double,_std::allocator<double>_>::size(this_01);
      if (pFVar4 <= this_00) break;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                          (size_type)in_stack_fffffffffffffdd8);
      local_18 = *pvVar5 + local_18;
      local_1c = local_1c + 1;
    }
    bVar1 = Globals::EqualProbability((double)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar6 = std::operator<<(local_198,"Warning! - FSDist_COF::SanityCheck sfacI=");
      sum = (ostream *)std::ostream::operator<<(poVar6,local_c);
      sfacI_00 = (Index)((ulong)poVar6 >> 0x20);
      poVar6 = std::operator<<(sum," does not sum to 1.0, but to ");
      this_02 = (void *)std::ostream::operator<<(poVar6,local_18);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      dVar7 = local_18 + -1.0;
      std::abs((int)this_02);
      if (1e-09 <= dVar7) {
        arg = (stringstream *)__cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffffde0,arg);
        __cxa_throw(arg,&E::typeinfo,E::~E);
      }
      in_stack_fffffffffffffde0 =
           (E *)std::operator<<(local_198,"Renormalizing, since the difference is < 1e-9.");
      std::ostream::operator<<(in_stack_fffffffffffffde0,std::endl<char,std::char_traits<char>>);
      Normalize(this_00,sfacI_00,(double)sum);
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)&std::cerr,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::stringstream::~stringstream(local_1a8);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void FSDist_COF::SanityCheck()
{
    //cout << "Starting FSDist_COF<M>::SanityCheck()"<<endl;
    for(Index sfacI=0; sfacI < _m_probs.size(); sfacI++)
    {
        double psum = 0.0;
        for(Index valI=0; valI < _m_probs.at(sfacI).size(); valI++)
            psum += _m_probs.at(sfacI).at(valI);

        if(!Globals::EqualProbability(psum, 1.0))
        {
            stringstream ss;
            ss << "Warning! - FSDist_COF::SanityCheck sfacI="<<sfacI<<" does not sum to 1.0, but to " << psum << endl;
            if(  abs(psum - 1.0) < 1e-9  )
            {
                ss << "Renormalizing, since the difference is < 1e-9."<<endl;
		Normalize(sfacI, psum);

                cerr << ss.str();
            }
            else
                throw(E(ss));
        }
    }
}